

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

btCollisionShape * __thiscall
btCollisionWorldImporter::createConeShapeX
          (btCollisionWorldImporter *this,btScalar radius,btScalar height)

{
  btCollisionShape *this_00;
  btConeShapeX *shape;
  btConeShapeX *in_stack_ffffffffffffffd0;
  
  this_00 = (btCollisionShape *)btConeShape::operator_new(0x187a39);
  btConeShapeX::btConeShapeX
            (in_stack_ffffffffffffffd0,(btScalar)((ulong)this_00 >> 0x20),SUB84(this_00,0));
  btAlignedObjectArray<btCollisionShape_*>::push_back
            ((btAlignedObjectArray<btCollisionShape_*> *)this_00,(btCollisionShape **)this_00);
  return this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createConeShapeX(btScalar radius,btScalar height)
{
	btConeShapeX* shape = new btConeShapeX(radius,height);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}